

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

optional<bool>
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  optimistic_lock *poVar1;
  read_critical_section *prVar2;
  read_critical_section *prVar3;
  bool bVar4;
  node_type nVar5;
  atomic<long> *paVar6;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this;
  version_type other;
  pointer poVar7;
  find_result fVar8;
  bool local_5c1;
  basic_node_ptr<unodb::detail::olc_node_header> local_5c0 [3];
  write_guard local_5a8;
  write_guard child_guard_1;
  write_guard node_guard_1;
  write_guard parent_guard;
  db_inode_unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte>_>_>
  smaller_node;
  write_guard local_578;
  write_guard child_guard;
  write_guard local_568;
  write_guard node_guard;
  bool is_node_min_size;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *leaf;
  optimistic_lock local_540;
  optimistic_lock *child_lock;
  bool local_519;
  type *local_518;
  type *found_child;
  type *child_i;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *local_500;
  read_critical_section *local_4f8;
  read_critical_section *node_critical_section_local;
  read_critical_section *parent_critical_section_local;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance_local;
  olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *poStack_4d8;
  byte key_byte_local;
  olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode_local;
  basic_art_key<unsigned_long> k_local;
  bool result_18;
  bool result_15;
  bool result_12;
  bool result_9;
  bool result_6;
  bool result_3;
  bool result;
  bool result_1;
  bool result_4;
  bool result_7;
  bool result_10;
  bool result_13;
  bool result_16;
  bool result_19;
  bool result_20;
  version_type local_320;
  version_tag_type local_318;
  byte local_309;
  optimistic_lock *poStack_308;
  bool result_17;
  version_type local_300;
  version_tag_type local_2f8;
  byte local_2e9;
  optimistic_lock *poStack_2e8;
  bool result_14;
  version_type local_2e0;
  version_tag_type local_2d8;
  byte local_2c9;
  optimistic_lock *poStack_2c8;
  bool result_11;
  version_type local_2c0;
  version_tag_type local_2b8;
  byte local_2a9;
  optimistic_lock *poStack_2a8;
  bool result_8;
  version_type local_2a0;
  version_tag_type local_298;
  byte local_289;
  optimistic_lock *poStack_288;
  bool result_5;
  version_type local_280;
  version_tag_type local_278;
  byte local_269;
  optimistic_lock *poStack_268;
  bool result_2;
  version_type local_260;
  long local_258;
  __int_type_conflict old_value_6;
  long local_248;
  __int_type_conflict old_value_5;
  long local_238;
  __int_type_conflict old_value_4;
  long local_228;
  __int_type_conflict old_value_3;
  long local_218;
  __int_type_conflict old_value_2;
  long local_208;
  __int_type_conflict old_value_1;
  long local_1f8;
  __int_type_conflict old_value;
  long local_1e8;
  memory_order local_1e0;
  int local_1dc;
  memory_order __b;
  long local_1d0;
  memory_order local_1c8;
  int local_1c4;
  memory_order __b_1;
  long local_1b8;
  memory_order local_1b0;
  int local_1ac;
  memory_order __b_2;
  long local_1a0;
  memory_order local_198;
  int local_194;
  memory_order __b_3;
  long local_188;
  memory_order local_180;
  int local_17c;
  memory_order __b_4;
  long local_170;
  memory_order local_168;
  int local_164;
  memory_order __b_5;
  long local_158;
  memory_order local_150;
  int local_14c;
  memory_order __b_6;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  long local_120;
  undefined8 local_118;
  undefined4 local_10c;
  undefined8 local_108;
  atomic<long> *local_100;
  long local_f8;
  undefined8 local_f0;
  undefined4 local_e4;
  undefined8 local_e0;
  atomic<long> *local_d8;
  long local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  atomic<long> *local_b0;
  long local_a8;
  undefined8 local_a0;
  undefined4 local_94;
  undefined8 local_90;
  atomic<long> *local_88;
  long local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  atomic<long> *local_60;
  long local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  atomic<long> *local_38;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  local_4f8 = node_critical_section;
  node_critical_section_local = parent_critical_section;
  parent_critical_section_local = (read_critical_section *)db_instance;
  db_instance_local._7_1_ = key_byte;
  poStack_4d8 = inode;
  inode_local = (olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                k.field_0;
  fVar8 = olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
          find_child(inode,key_byte);
  local_500 = fVar8.second;
  child_i._0_1_ = fVar8.first;
  found_child = (type *)std::
                        get<0ul,unsigned_char,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>
                                  ((pair<unsigned_char,_unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                                    *)&child_i);
  local_518 = std::
              get<1ul,unsigned_char,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>
                        ((pair<unsigned_char,_unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                          *)&child_i);
  prVar3 = node_critical_section_local;
  if (*local_518 == (type)0x0) {
    poVar1 = node_critical_section_local->lock;
    local_260.version = (node_critical_section_local->version).version;
    paVar6 = &poVar1->read_lock_count;
    local_1dc = 2;
    poStack_268 = poVar1;
    ___b = paVar6;
    local_1e0 = std::operator&(acquire,__memory_order_mask);
    if (local_1dc - 1U < 2) {
      local_1e8 = (paVar6->super___atomic_base<long>)._M_i;
    }
    else if (local_1dc == 5) {
      local_1e8 = (paVar6->super___atomic_base<long>)._M_i;
    }
    else {
      local_1e8 = (paVar6->super___atomic_base<long>)._M_i;
    }
    if (local_1e8 < 1) {
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    local_13c = 2;
    local_278 = (version_tag_type)
                optimistic_lock::atomic_version_type::load_relaxed(&poVar1->version);
    local_269 = optimistic_lock::version_type::operator==(&local_260,(version_type)local_278);
    if (((local_269 ^ 0xff) & 1) != 0) {
      optimistic_lock::dec_read_lock_count(poVar1);
    }
    prVar2 = local_4f8;
    if ((local_269 & 1) != 0) {
      local_100 = &poVar1->read_lock_count;
      local_108 = 1;
      local_10c = 3;
      local_118 = 1;
      LOCK();
      local_1f8 = (local_100->super___atomic_base<long>)._M_i;
      (local_100->super___atomic_base<long>)._M_i = (local_100->super___atomic_base<long>)._M_i + -1
      ;
      UNLOCK();
      old_value = (__int_type_conflict)poVar1;
      local_120 = local_1f8;
      if (local_1f8 < 1) {
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
    }
    prVar3->lock = (optimistic_lock *)0x0;
    if (((local_269 & 1 ^ 0xff) & 1) == 0) {
      poVar1 = local_4f8->lock;
      local_280.version = (local_4f8->version).version;
      paVar6 = &poVar1->read_lock_count;
      local_1c4 = 2;
      poStack_288 = poVar1;
      ___b_1 = paVar6;
      local_1c8 = std::operator&(acquire,__memory_order_mask);
      if (local_1c4 - 1U < 2) {
        local_1d0 = (paVar6->super___atomic_base<long>)._M_i;
      }
      else if (local_1c4 == 5) {
        local_1d0 = (paVar6->super___atomic_base<long>)._M_i;
      }
      else {
        local_1d0 = (paVar6->super___atomic_base<long>)._M_i;
      }
      if (local_1d0 < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      local_138 = 2;
      local_298 = (version_tag_type)
                  optimistic_lock::atomic_version_type::load_relaxed(&poVar1->version);
      local_289 = optimistic_lock::version_type::operator==(&local_280,(version_type)local_298);
      if (((local_289 ^ 0xff) & 1) != 0) {
        optimistic_lock::dec_read_lock_count(poVar1);
      }
      if ((local_289 & 1) != 0) {
        local_d8 = &poVar1->read_lock_count;
        local_e0 = 1;
        local_e4 = 3;
        local_f0 = 1;
        LOCK();
        local_208 = (local_d8->super___atomic_base<long>)._M_i;
        (local_d8->super___atomic_base<long>)._M_i = (local_d8->super___atomic_base<long>)._M_i + -1
        ;
        UNLOCK();
        old_value_1 = (__int_type_conflict)poVar1;
        local_f8 = local_208;
        if (local_208 < 1) {
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
      }
      prVar2->lock = (optimistic_lock *)0x0;
      if (((local_289 & 1 ^ 0xff) & 1) == 0) {
        local_519 = false;
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)((long)&k_local.field_0 + 6),&local_519);
      }
      else {
        std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
      }
    }
    else {
      std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
    }
  }
  else {
    child_lock = (optimistic_lock *)
                 in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                 ::load(*local_518);
    child->tagged_ptr = (uintptr_t)child_lock;
    bVar4 = optimistic_lock::read_critical_section::check(local_4f8);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      local_540.obsoleter_thread._M_thread = (native_handle_type)node_ptr_lock(child);
      optimistic_lock::try_read_lock(&local_540);
      optimistic_lock::read_critical_section::operator=
                (child_critical_section,(read_critical_section *)&local_540);
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&local_540);
      bVar4 = optimistic_lock::read_critical_section::must_restart(child_critical_section);
      if (bVar4) {
        std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
      }
      else {
        nVar5 = basic_node_ptr<unodb::detail::olc_node_header>::type(child);
        prVar3 = node_critical_section_local;
        *child_type = nVar5;
        if (*child_type == LEAF) {
          this = basic_node_ptr<unodb::detail::olc_node_header>::
                 ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>*>
                           (child);
          bVar4 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::matches
                            (this,(art_key_type)inode_local);
          prVar3 = node_critical_section_local;
          if (bVar4) {
            node_guard.lock._6_1_ =
                 basic_inode<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>,_5U,_16U,_(unodb::node_type)2,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 ::is_min_size((basic_inode<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>,_5U,_16U,_(unodb::node_type)2,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                                *)poStack_4d8);
            prVar3 = node_critical_section_local;
            if (((node_guard.lock._6_1_ ^ 0xff) & 1) == 0) {
              if (!(bool)node_guard.lock._6_1_) {
                __assert_fail("is_node_min_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                              ,0x61a,
                              "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>]"
                             );
              }
              basic_inode<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              ::
              create<unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&>
                        ((basic_inode<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                          *)&parent_guard,(db_type *)parent_critical_section_local,poStack_4d8);
              optimistic_lock::write_guard::write_guard(&node_guard_1,node_critical_section_local);
              bVar4 = optimistic_lock::write_guard::must_restart(&node_guard_1);
              if (bVar4) {
                std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                child_guard.lock._4_4_ = 1;
              }
              else {
                optimistic_lock::write_guard::write_guard(&child_guard_1,local_4f8);
                bVar4 = optimistic_lock::write_guard::must_restart(&child_guard_1);
                if (bVar4) {
                  std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                  child_guard.lock._4_4_ = 1;
                }
                else {
                  optimistic_lock::write_guard::write_guard(&local_5a8,child_critical_section);
                  bVar4 = optimistic_lock::write_guard::must_restart(&local_5a8);
                  if (bVar4) {
                    std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                    child_guard.lock._4_4_ = 1;
                  }
                  else {
                    poVar7 = std::
                             unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ::operator->((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                           *)&parent_guard);
                    olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::init(poVar7,(EVP_PKEY_CTX *)parent_critical_section_local);
                    poVar7 = std::
                             unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ::release((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                        *)&parent_guard);
                    basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
                              (local_5c0,(header_type *)poVar7,I4);
                    in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    ::operator=(node_in_parent,local_5c0[0]);
                    bVar4 = optimistic_lock::write_guard::active(&child_guard_1);
                    if (((bVar4 ^ 0xffU) & 1) == 0) {
                      __assert_fail("!node_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x644,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>]"
                                   );
                    }
                    bVar4 = optimistic_lock::write_guard::active(&local_5a8);
                    if (((bVar4 ^ 0xffU) & 1) == 0) {
                      __assert_fail("!child_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x645,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>]"
                                   );
                    }
                    *child_in_parent =
                         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                          *)0x0;
                    child_guard.lock._4_4_ = 0;
                  }
                  optimistic_lock::write_guard::~write_guard(&local_5a8);
                }
                optimistic_lock::write_guard::~write_guard(&child_guard_1);
              }
              optimistic_lock::write_guard::~write_guard(&node_guard_1);
              std::
              unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             *)&parent_guard);
              if (child_guard.lock._4_4_ == 0) {
                olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                account_shrinking_inode<(unodb::node_type)2>
                          ((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                            *)parent_critical_section_local);
                local_5c1 = true;
                std::optional<bool>::optional<bool,_true>
                          ((optional<bool> *)((long)&k_local.field_0 + 6),&local_5c1);
              }
            }
            else {
              poVar1 = node_critical_section_local->lock;
              local_320.version = (node_critical_section_local->version).version;
              paVar6 = &poVar1->read_lock_count;
              local_14c = 2;
              ___b_6 = paVar6;
              local_150 = std::operator&(acquire,__memory_order_mask);
              if (local_14c - 1U < 2) {
                local_158 = (paVar6->super___atomic_base<long>)._M_i;
              }
              else if (local_14c == 5) {
                local_158 = (paVar6->super___atomic_base<long>)._M_i;
              }
              else {
                local_158 = (paVar6->super___atomic_base<long>)._M_i;
              }
              if (local_158 < 1) {
                __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
              }
              local_124 = 2;
              other = optimistic_lock::atomic_version_type::load_relaxed(&poVar1->version);
              bVar4 = optimistic_lock::version_type::operator==(&local_320,other);
              if (((bVar4 ^ 0xffU) & 1) != 0) {
                optimistic_lock::dec_read_lock_count(poVar1);
              }
              if (bVar4) {
                local_10 = &poVar1->read_lock_count;
                local_18 = 1;
                local_1c = 3;
                local_28 = 1;
                LOCK();
                local_258 = (local_10->super___atomic_base<long>)._M_i;
                (local_10->super___atomic_base<long>)._M_i =
                     (local_10->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                old_value_6 = (__int_type_conflict)poVar1;
                local_30 = local_258;
                if (local_258 < 1) {
                  __assert_fail("old_value > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
                }
              }
              prVar3->lock = (optimistic_lock *)0x0;
              if (((bVar4 ^ 0xffU) & 1) == 0) {
                optimistic_lock::write_guard::write_guard(&local_568,local_4f8);
                bVar4 = optimistic_lock::write_guard::must_restart(&local_568);
                if (bVar4) {
                  std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                  child_guard.lock._4_4_ = 1;
                }
                else {
                  optimistic_lock::write_guard::write_guard(&local_578,child_critical_section);
                  bVar4 = optimistic_lock::write_guard::must_restart(&local_578);
                  if (bVar4) {
                    std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                  }
                  else {
                    optimistic_lock::write_guard::unlock_and_obsolete(&local_578);
                    olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::remove(poStack_4d8,(char *)(ulong)*(byte *)found_child);
                    *child_in_parent =
                         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                          *)0x0;
                    smaller_node._M_t.
                    super___uniq_ptr_impl<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    .
                    super__Head_base<0UL,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                    ._M_head_impl._7_1_ = 1;
                    std::optional<bool>::optional<bool,_true>
                              ((optional<bool> *)((long)&k_local.field_0 + 6),
                               (bool *)((long)&smaller_node._M_t.
                                               super___uniq_ptr_impl<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                               .
                                               super__Head_base<0UL,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                                               ._M_head_impl + 7));
                  }
                  child_guard.lock._4_4_ = 1;
                  optimistic_lock::write_guard::~write_guard(&local_578);
                }
                optimistic_lock::write_guard::~write_guard(&local_568);
              }
              else {
                std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
              }
            }
          }
          else {
            poVar1 = node_critical_section_local->lock;
            local_2c0.version = (node_critical_section_local->version).version;
            paVar6 = &poVar1->read_lock_count;
            local_194 = 2;
            poStack_2c8 = poVar1;
            ___b_3 = paVar6;
            local_198 = std::operator&(acquire,__memory_order_mask);
            if (local_194 - 1U < 2) {
              local_1a0 = (paVar6->super___atomic_base<long>)._M_i;
            }
            else if (local_194 == 5) {
              local_1a0 = (paVar6->super___atomic_base<long>)._M_i;
            }
            else {
              local_1a0 = (paVar6->super___atomic_base<long>)._M_i;
            }
            if (local_1a0 < 1) {
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            local_130 = 2;
            local_2d8 = (version_tag_type)
                        optimistic_lock::atomic_version_type::load_relaxed(&poVar1->version);
            local_2c9 = optimistic_lock::version_type::operator==
                                  (&local_2c0,(version_type)local_2d8);
            if (((local_2c9 ^ 0xff) & 1) != 0) {
              optimistic_lock::dec_read_lock_count(poVar1);
            }
            prVar2 = local_4f8;
            if ((local_2c9 & 1) != 0) {
              local_88 = &poVar1->read_lock_count;
              local_90 = 1;
              local_94 = 3;
              local_a0 = 1;
              LOCK();
              local_228 = (local_88->super___atomic_base<long>)._M_i;
              (local_88->super___atomic_base<long>)._M_i =
                   (local_88->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              old_value_3 = (__int_type_conflict)poVar1;
              local_a8 = local_228;
              if (local_228 < 1) {
                __assert_fail("old_value > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
              }
            }
            prVar3->lock = (optimistic_lock *)0x0;
            if (((local_2c9 & 1 ^ 0xff) & 1) == 0) {
              poVar1 = local_4f8->lock;
              local_2e0.version = (local_4f8->version).version;
              paVar6 = &poVar1->read_lock_count;
              local_17c = 2;
              poStack_2e8 = poVar1;
              ___b_4 = paVar6;
              local_180 = std::operator&(acquire,__memory_order_mask);
              if (local_17c - 1U < 2) {
                local_188 = (paVar6->super___atomic_base<long>)._M_i;
              }
              else if (local_17c == 5) {
                local_188 = (paVar6->super___atomic_base<long>)._M_i;
              }
              else {
                local_188 = (paVar6->super___atomic_base<long>)._M_i;
              }
              if (local_188 < 1) {
                __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
              }
              local_12c = 2;
              local_2f8 = (version_tag_type)
                          optimistic_lock::atomic_version_type::load_relaxed(&poVar1->version);
              local_2e9 = optimistic_lock::version_type::operator==
                                    (&local_2e0,(version_type)local_2f8);
              if (((local_2e9 ^ 0xff) & 1) != 0) {
                optimistic_lock::dec_read_lock_count(poVar1);
              }
              if ((local_2e9 & 1) != 0) {
                local_60 = &poVar1->read_lock_count;
                local_68 = 1;
                local_6c = 3;
                local_78 = 1;
                LOCK();
                local_238 = (local_60->super___atomic_base<long>)._M_i;
                (local_60->super___atomic_base<long>)._M_i =
                     (local_60->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                old_value_4 = (__int_type_conflict)poVar1;
                local_80 = local_238;
                if (local_238 < 1) {
                  __assert_fail("old_value > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
                }
              }
              prVar2->lock = (optimistic_lock *)0x0;
              if (((local_2e9 & 1 ^ 0xff) & 1) == 0) {
                poVar1 = child_critical_section->lock;
                local_300.version = (child_critical_section->version).version;
                paVar6 = &poVar1->read_lock_count;
                local_164 = 2;
                poStack_308 = poVar1;
                ___b_5 = paVar6;
                local_168 = std::operator&(acquire,__memory_order_mask);
                if (local_164 - 1U < 2) {
                  local_170 = (paVar6->super___atomic_base<long>)._M_i;
                }
                else if (local_164 == 5) {
                  local_170 = (paVar6->super___atomic_base<long>)._M_i;
                }
                else {
                  local_170 = (paVar6->super___atomic_base<long>)._M_i;
                }
                if (local_170 < 1) {
                  __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
                }
                local_128 = 2;
                local_318 = (version_tag_type)
                            optimistic_lock::atomic_version_type::load_relaxed(&poVar1->version);
                local_309 = optimistic_lock::version_type::operator==
                                      (&local_300,(version_type)local_318);
                if (((local_309 ^ 0xff) & 1) != 0) {
                  optimistic_lock::dec_read_lock_count(poVar1);
                }
                if ((local_309 & 1) != 0) {
                  local_38 = &poVar1->read_lock_count;
                  local_40 = 1;
                  local_44 = 3;
                  local_50 = 1;
                  LOCK();
                  local_248 = (local_38->super___atomic_base<long>)._M_i;
                  (local_38->super___atomic_base<long>)._M_i =
                       (local_38->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  old_value_5 = (__int_type_conflict)poVar1;
                  local_58 = local_248;
                  if (local_248 < 1) {
                    __assert_fail("old_value > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                  ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const")
                    ;
                  }
                }
                child_critical_section->lock = (optimistic_lock *)0x0;
                if (((local_309 & 1 ^ 0xff) & 1) == 0) {
                  node_guard.lock._7_1_ = 0;
                  std::optional<bool>::optional<bool,_true>
                            ((optional<bool> *)((long)&k_local.field_0 + 6),
                             (bool *)((long)&node_guard.lock + 7));
                }
                else {
                  std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
                }
              }
              else {
                std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
              }
            }
            else {
              std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
            }
          }
        }
        else {
          *child_in_parent = *local_518;
          poVar1 = node_critical_section_local->lock;
          local_2a0.version = (node_critical_section_local->version).version;
          paVar6 = &poVar1->read_lock_count;
          local_1ac = 2;
          poStack_2a8 = poVar1;
          ___b_2 = paVar6;
          local_1b0 = std::operator&(acquire,__memory_order_mask);
          if (local_1ac - 1U < 2) {
            local_1b8 = (paVar6->super___atomic_base<long>)._M_i;
          }
          else if (local_1ac == 5) {
            local_1b8 = (paVar6->super___atomic_base<long>)._M_i;
          }
          else {
            local_1b8 = (paVar6->super___atomic_base<long>)._M_i;
          }
          if (local_1b8 < 1) {
            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
          }
          local_134 = 2;
          local_2b8 = (version_tag_type)
                      optimistic_lock::atomic_version_type::load_relaxed(&poVar1->version);
          local_2a9 = optimistic_lock::version_type::operator==(&local_2a0,(version_type)local_2b8);
          if (((local_2a9 ^ 0xff) & 1) != 0) {
            optimistic_lock::dec_read_lock_count(poVar1);
          }
          if ((local_2a9 & 1) != 0) {
            local_b0 = &poVar1->read_lock_count;
            local_b8 = 1;
            local_bc = 3;
            local_c8 = 1;
            LOCK();
            local_218 = (local_b0->super___atomic_base<long>)._M_i;
            (local_b0->super___atomic_base<long>)._M_i =
                 (local_b0->super___atomic_base<long>)._M_i + -1;
            UNLOCK();
            old_value_2 = (__int_type_conflict)poVar1;
            local_d0 = local_218;
            if (local_218 < 1) {
              __assert_fail("old_value > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
            }
          }
          prVar3->lock = (optimistic_lock *)0x0;
          if (((local_2a9 & 1 ^ 0xff) & 1) == 0) {
            leaf._7_1_ = 1;
            std::optional<bool>::optional<bool,_true>
                      ((optional<bool> *)((long)&k_local.field_0 + 6),(bool *)((long)&leaf + 7));
          }
          else {
            std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
          }
        }
      }
    }
    else {
      std::optional<bool>::optional((optional<bool> *)((long)&k_local.field_0 + 6));
    }
  }
  return (_Optional_base<bool,_true,_true>)
         (_Optional_base<bool,_true,_true>)k_local.field_0.key._6_2_;
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}